

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3VMPrintf(sqlite3 *db,char *zFormat,__va_list_tag *ap)

{
  char *pcVar1;
  long in_FS_OFFSET;
  char zBase [70];
  StrAccum local_90;
  char local_68 [80];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_90.mxAlloc = db->aLimit[0];
  local_90.zBase = local_68;
  local_90.nChar = 0;
  local_90.nAlloc = 0x46;
  local_90.accError = '\0';
  local_90.printfFlags = '\x01';
  local_90.db = db;
  local_90.zText = local_90.zBase;
  sqlite3VXPrintf(&local_90,zFormat,ap);
  pcVar1 = sqlite3StrAccumFinish(&local_90);
  if (((local_90.accError == '\x01') && (db->mallocFailed == '\0')) && (db->bBenignMalloc == '\0'))
  {
    db->mallocFailed = '\x01';
    if (0 < db->nVdbeExec) {
      (db->u1).isInterrupted = 1;
    }
    (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pcVar1;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE char *sqlite3VMPrintf(sqlite3 *db, const char *zFormat, va_list ap){
  char *z;
  char zBase[SQLITE_PRINT_BUF_SIZE];
  StrAccum acc;
  assert( db!=0 );
  sqlite3StrAccumInit(&acc, db, zBase, sizeof(zBase),
                      db->aLimit[SQLITE_LIMIT_LENGTH]);
  acc.printfFlags = SQLITE_PRINTF_INTERNAL;
  sqlite3VXPrintf(&acc, zFormat, ap);
  z = sqlite3StrAccumFinish(&acc);
  if( acc.accError==STRACCUM_NOMEM ){
    sqlite3OomFault(db);
  }
  return z;
}